

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O0

void Msat_IntVecPushUniqueOrder(Msat_IntVec_t *p,int Entry,int fIncrease)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int i;
  int Entry2;
  int Entry1;
  int fIncrease_local;
  int Entry_local;
  Msat_IntVec_t *p_local;
  
  Msat_IntVecPushUnique(p,Entry);
  iVar3 = p->nSize;
  while( true ) {
    local_24 = iVar3 + -1;
    if (local_24 < 1) {
      return;
    }
    iVar1 = p->pArray[local_24];
    iVar2 = p->pArray[iVar3 + -2];
    if ((fIncrease != 0) && (iVar2 <= iVar1)) break;
    if ((fIncrease == 0) && (iVar1 <= iVar2)) {
      return;
    }
    p->pArray[local_24] = iVar2;
    p->pArray[iVar3 + -2] = iVar1;
    iVar3 = local_24;
  }
  return;
}

Assistant:

void Msat_IntVecPushUniqueOrder( Msat_IntVec_t * p, int Entry, int fIncrease )
{
    int Entry1, Entry2;
    int i;
    Msat_IntVecPushUnique( p, Entry );
    // find the p of the node
    for ( i = p->nSize-1; i > 0; i-- )
    {
        Entry1 = p->pArray[i  ];
        Entry2 = p->pArray[i-1];
        if (( fIncrease && Entry1 >= Entry2) ||
            (!fIncrease && Entry1 <= Entry2) )
            break;
        p->pArray[i  ] = Entry2;
        p->pArray[i-1] = Entry1;
    }
}